

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _GLOBAL__N_1 a_Stack_28 [16];
  
  if (0 < (long)*(int *)(desc + 4)) {
    lVar5 = *(long *)(desc + 0x38);
    lVar4 = 0;
    do {
      bVar1 = *(byte *)(lVar5 + 1 + lVar4);
      if (*(char *)(lVar5 + 3 + lVar4) < '\0') {
        if ((bVar1 & 0x10) == 0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xac6);
        }
        lVar2 = *(long *)(lVar5 + 0x28 + lVar4);
        if (lVar2 == 0) {
LAB_0016a7ba:
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xa9a);
        }
        if ((*(int *)(lVar2 + 4) == 1) && ((*(byte *)(*(long *)(lVar2 + 0x30) + 1) & 2) != 0)) {
          _GLOBAL__N_1::ContainsProto3Optional(a_Stack_28);
          goto LAB_0016a7ba;
        }
      }
      else if ((bVar1 & 0x10) != 0) {
        if (*(long *)(lVar5 + 0x28 + lVar4) != 0) {
          return true;
        }
        goto LAB_0016a7ba;
      }
      lVar4 = lVar4 + 0x58;
    } while ((long)*(int *)(desc + 4) * 0x58 - lVar4 != 0);
  }
  if (*(int *)(desc + 0x80) < 1) {
    bVar3 = false;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      bVar3 = ContainsProto3Optional((Descriptor *)(*(long *)(desc + 0x48) + lVar5));
      if (bVar3) {
        return bVar3;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
    } while (lVar4 < *(int *)(desc + 0x80));
  }
  return bVar3;
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}